

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O2

string * __thiscall BMP::getBit_abi_cxx11_(string *__return_storage_ptr__,BMP *this,int a)

{
  pointer pcVar1;
  allocator local_19;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_19);
  for (; a != 0; a = a >> 1) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
  std::__reverse<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            (pcVar1,pcVar1 + __return_storage_ptr__->_M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string BMP::getBit(int a)
{
    using namespace std;

    string x = "";
    while ( a != 0 ){
        if ( a & 1 ){
            x += '1';
        }
        else
            x += '0';
        a = a >> 1;

    }

    reverse( x.begin(), x.end() );

    return x;
}